

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O2

UBool __thiscall
icu_63::DateFormatSymbols::operator==(DateFormatSymbols *this,DateFormatSymbols *other)

{
  UBool UVar1;
  int iVar2;
  int iVar3;
  UBool cmpres;
  int32_t i;
  long lVar4;
  
  if (this == other) {
    return '\x01';
  }
  iVar3 = this->fErasCount;
  if ((((((iVar3 == other->fErasCount) && (this->fEraNamesCount == other->fEraNamesCount)) &&
        (this->fNarrowErasCount == other->fNarrowErasCount)) &&
       (((this->fMonthsCount == other->fMonthsCount &&
         (this->fShortMonthsCount == other->fShortMonthsCount)) &&
        ((this->fNarrowMonthsCount == other->fNarrowMonthsCount &&
         ((this->fStandaloneMonthsCount == other->fStandaloneMonthsCount &&
          (this->fStandaloneShortMonthsCount == other->fStandaloneShortMonthsCount)))))))) &&
      ((this->fStandaloneNarrowMonthsCount == other->fStandaloneNarrowMonthsCount &&
       (((((this->fWeekdaysCount == other->fWeekdaysCount &&
           (this->fShortWeekdaysCount == other->fShortWeekdaysCount)) &&
          (this->fShorterWeekdaysCount == other->fShorterWeekdaysCount)) &&
         ((this->fNarrowWeekdaysCount == other->fNarrowWeekdaysCount &&
          (this->fStandaloneWeekdaysCount == other->fStandaloneWeekdaysCount)))) &&
        (this->fStandaloneShortWeekdaysCount == other->fStandaloneShortWeekdaysCount)))))) &&
     (((((((this->fStandaloneShorterWeekdaysCount == other->fStandaloneShorterWeekdaysCount &&
           (this->fStandaloneNarrowWeekdaysCount == other->fStandaloneNarrowWeekdaysCount)) &&
          (((((this->fAmPmsCount == other->fAmPmsCount &&
              (((this->fNarrowAmPmsCount == other->fNarrowAmPmsCount &&
                (this->fQuartersCount == other->fQuartersCount)) &&
               (this->fShortQuartersCount == other->fShortQuartersCount)))) &&
             (((this->fStandaloneQuartersCount == other->fStandaloneQuartersCount &&
               (this->fStandaloneShortQuartersCount == other->fStandaloneShortQuartersCount)) &&
              (this->fLeapMonthPatternsCount == other->fLeapMonthPatternsCount)))) &&
            ((this->fShortYearNamesCount == other->fShortYearNamesCount &&
             (this->fShortZodiacNamesCount == other->fShortZodiacNamesCount)))) &&
           ((this->fAbbreviatedDayPeriodsCount == other->fAbbreviatedDayPeriodsCount &&
            (((this->fWideDayPeriodsCount == other->fWideDayPeriodsCount &&
              (this->fNarrowDayPeriodsCount == other->fNarrowDayPeriodsCount)) &&
             (this->fStandaloneAbbreviatedDayPeriodsCount ==
              other->fStandaloneAbbreviatedDayPeriodsCount)))))))) &&
         ((this->fStandaloneWideDayPeriodsCount == other->fStandaloneWideDayPeriodsCount &&
          (this->fStandaloneNarrowDayPeriodsCount == other->fStandaloneNarrowDayPeriodsCount)))) &&
        (iVar2 = bcmp(this->fCapitalization,other->fCapitalization,0x1c), iVar2 == 0)) &&
       (((((UVar1 = arrayCompare(this->fEras,other->fEras,iVar3), UVar1 != '\0' &&
           (UVar1 = arrayCompare(this->fEraNames,other->fEraNames,this->fEraNamesCount),
           UVar1 != '\0')) &&
          ((UVar1 = arrayCompare(this->fNarrowEras,other->fNarrowEras,this->fNarrowErasCount),
           UVar1 != '\0' &&
           ((((UVar1 = arrayCompare(this->fMonths,other->fMonths,this->fMonthsCount), UVar1 != '\0'
              && (UVar1 = arrayCompare(this->fShortMonths,other->fShortMonths,
                                       this->fShortMonthsCount), UVar1 != '\0')) &&
             (UVar1 = arrayCompare(this->fNarrowMonths,other->fNarrowMonths,this->fNarrowMonthsCount
                                  ), UVar1 != '\0')) &&
            ((UVar1 = arrayCompare(this->fStandaloneMonths,other->fStandaloneMonths,
                                   this->fStandaloneMonthsCount), UVar1 != '\0' &&
             (UVar1 = arrayCompare(this->fStandaloneShortMonths,other->fStandaloneShortMonths,
                                   this->fStandaloneShortMonthsCount), UVar1 != '\0')))))))) &&
         (UVar1 = arrayCompare(this->fStandaloneNarrowMonths,other->fStandaloneNarrowMonths,
                               this->fStandaloneNarrowMonthsCount), UVar1 != '\0')) &&
        (((UVar1 = arrayCompare(this->fWeekdays,other->fWeekdays,this->fWeekdaysCount),
          UVar1 != '\0' &&
          (UVar1 = arrayCompare(this->fShortWeekdays,other->fShortWeekdays,this->fShortWeekdaysCount
                               ), UVar1 != '\0')) &&
         (((UVar1 = arrayCompare(this->fShorterWeekdays,other->fShorterWeekdays,
                                 this->fShorterWeekdaysCount), UVar1 != '\0' &&
           (((UVar1 = arrayCompare(this->fNarrowWeekdays,other->fNarrowWeekdays,
                                   this->fNarrowWeekdaysCount), UVar1 != '\0' &&
             (UVar1 = arrayCompare(this->fStandaloneWeekdays,other->fStandaloneWeekdays,
                                   this->fStandaloneWeekdaysCount), UVar1 != '\0')) &&
            (UVar1 = arrayCompare(this->fStandaloneShortWeekdays,other->fStandaloneShortWeekdays,
                                  this->fStandaloneShortWeekdaysCount), UVar1 != '\0')))) &&
          (((UVar1 = arrayCompare(this->fStandaloneShorterWeekdays,other->fStandaloneShorterWeekdays
                                  ,this->fStandaloneShorterWeekdaysCount), UVar1 != '\0' &&
            (UVar1 = arrayCompare(this->fStandaloneNarrowWeekdays,other->fStandaloneNarrowWeekdays,
                                  this->fStandaloneNarrowWeekdaysCount), UVar1 != '\0')) &&
           (UVar1 = arrayCompare(this->fAmPms,other->fAmPms,this->fAmPmsCount), UVar1 != '\0')))))))
        ))) && (((UVar1 = arrayCompare(this->fNarrowAmPms,other->fNarrowAmPms,
                                       this->fNarrowAmPmsCount), UVar1 != '\0' &&
                 (UVar1 = icu_63::UnicodeString::operator==
                                    (&this->fTimeSeparator,&other->fTimeSeparator), UVar1 != '\0'))
                && (((UVar1 = arrayCompare(this->fQuarters,other->fQuarters,this->fQuartersCount),
                     UVar1 != '\0' &&
                     (((UVar1 = arrayCompare(this->fShortQuarters,other->fShortQuarters,
                                             this->fShortQuartersCount), UVar1 != '\0' &&
                       (UVar1 = arrayCompare(this->fStandaloneQuarters,other->fStandaloneQuarters,
                                             this->fStandaloneQuartersCount), UVar1 != '\0')) &&
                      (UVar1 = arrayCompare(this->fStandaloneShortQuarters,
                                            other->fStandaloneShortQuarters,
                                            this->fStandaloneShortQuartersCount), UVar1 != '\0'))))
                    && (((UVar1 = arrayCompare(this->fLeapMonthPatterns,other->fLeapMonthPatterns,
                                               this->fLeapMonthPatternsCount), UVar1 != '\0' &&
                         (UVar1 = arrayCompare(this->fShortYearNames,other->fShortYearNames,
                                               this->fShortYearNamesCount), UVar1 != '\0')) &&
                        ((UVar1 = arrayCompare(this->fShortZodiacNames,other->fShortZodiacNames,
                                               this->fShortZodiacNamesCount), UVar1 != '\0' &&
                         (((UVar1 = arrayCompare(this->fAbbreviatedDayPeriods,
                                                 other->fAbbreviatedDayPeriods,
                                                 this->fAbbreviatedDayPeriodsCount), UVar1 != '\0'
                           && (UVar1 = arrayCompare(this->fWideDayPeriods,other->fWideDayPeriods,
                                                    this->fWideDayPeriodsCount), UVar1 != '\0')) &&
                          ((UVar1 = arrayCompare(this->fNarrowDayPeriods,other->fNarrowDayPeriods,
                                                 this->fNarrowDayPeriodsCount), UVar1 != '\0' &&
                           (((UVar1 = arrayCompare(this->fStandaloneAbbreviatedDayPeriods,
                                                   other->fStandaloneAbbreviatedDayPeriods,
                                                   this->fStandaloneAbbreviatedDayPeriodsCount),
                             UVar1 != '\0' &&
                             (UVar1 = arrayCompare(this->fStandaloneWideDayPeriods,
                                                   other->fStandaloneWideDayPeriods,
                                                   this->fStandaloneWideDayPeriodsCount),
                             UVar1 != '\0')) &&
                            (UVar1 = arrayCompare(this->fStandaloneNarrowDayPeriods,
                                                  other->fStandaloneNarrowDayPeriods,
                                                  this->fStandaloneWideDayPeriodsCount),
                            UVar1 != '\0')))))))))))))))))) {
    if (this->fZoneStrings == (UnicodeString **)0x0 && other->fZoneStrings == (UnicodeString **)0x0)
    {
      UVar1 = Locale::operator==(&this->fZSFLocale,&other->fZSFLocale);
      if (UVar1 != '\0') {
        return '\x01';
      }
    }
    else if (((this->fZoneStrings != (UnicodeString **)0x0 &&
               other->fZoneStrings != (UnicodeString **)0x0) &&
             (iVar3 = this->fZoneStringsRowCount, iVar3 == other->fZoneStringsRowCount)) &&
            (this->fZoneStringsColCount == other->fZoneStringsColCount)) {
      UVar1 = '\x01';
      lVar4 = 0;
      while( true ) {
        if (UVar1 == '\0') {
          return '\0';
        }
        if (iVar3 <= lVar4) break;
        UVar1 = arrayCompare(this->fZoneStrings[lVar4],other->fZoneStrings[lVar4],
                             this->fZoneStringsColCount);
        lVar4 = lVar4 + 1;
        iVar3 = this->fZoneStringsRowCount;
      }
      return UVar1;
    }
  }
  return '\0';
}

Assistant:

UBool
DateFormatSymbols::operator==(const DateFormatSymbols& other) const
{
    // First do cheap comparisons
    if (this == &other) {
        return TRUE;
    }
    if (fErasCount == other.fErasCount &&
        fEraNamesCount == other.fEraNamesCount &&
        fNarrowErasCount == other.fNarrowErasCount &&
        fMonthsCount == other.fMonthsCount &&
        fShortMonthsCount == other.fShortMonthsCount &&
        fNarrowMonthsCount == other.fNarrowMonthsCount &&
        fStandaloneMonthsCount == other.fStandaloneMonthsCount &&
        fStandaloneShortMonthsCount == other.fStandaloneShortMonthsCount &&
        fStandaloneNarrowMonthsCount == other.fStandaloneNarrowMonthsCount &&
        fWeekdaysCount == other.fWeekdaysCount &&
        fShortWeekdaysCount == other.fShortWeekdaysCount &&
        fShorterWeekdaysCount == other.fShorterWeekdaysCount &&
        fNarrowWeekdaysCount == other.fNarrowWeekdaysCount &&
        fStandaloneWeekdaysCount == other.fStandaloneWeekdaysCount &&
        fStandaloneShortWeekdaysCount == other.fStandaloneShortWeekdaysCount &&
        fStandaloneShorterWeekdaysCount == other.fStandaloneShorterWeekdaysCount &&
        fStandaloneNarrowWeekdaysCount == other.fStandaloneNarrowWeekdaysCount &&
        fAmPmsCount == other.fAmPmsCount &&
        fNarrowAmPmsCount == other.fNarrowAmPmsCount &&
        fQuartersCount == other.fQuartersCount &&
        fShortQuartersCount == other.fShortQuartersCount &&
        fStandaloneQuartersCount == other.fStandaloneQuartersCount &&
        fStandaloneShortQuartersCount == other.fStandaloneShortQuartersCount &&
        fLeapMonthPatternsCount == other.fLeapMonthPatternsCount &&
        fShortYearNamesCount == other.fShortYearNamesCount &&
        fShortZodiacNamesCount == other.fShortZodiacNamesCount &&
        fAbbreviatedDayPeriodsCount == other.fAbbreviatedDayPeriodsCount &&
        fWideDayPeriodsCount == other.fWideDayPeriodsCount &&
        fNarrowDayPeriodsCount == other.fNarrowDayPeriodsCount &&
        fStandaloneAbbreviatedDayPeriodsCount == other.fStandaloneAbbreviatedDayPeriodsCount &&
        fStandaloneWideDayPeriodsCount == other.fStandaloneWideDayPeriodsCount &&
        fStandaloneNarrowDayPeriodsCount == other.fStandaloneNarrowDayPeriodsCount &&
        (uprv_memcmp(fCapitalization, other.fCapitalization, sizeof(fCapitalization))==0))
    {
        // Now compare the arrays themselves
        if (arrayCompare(fEras, other.fEras, fErasCount) &&
            arrayCompare(fEraNames, other.fEraNames, fEraNamesCount) &&
            arrayCompare(fNarrowEras, other.fNarrowEras, fNarrowErasCount) &&
            arrayCompare(fMonths, other.fMonths, fMonthsCount) &&
            arrayCompare(fShortMonths, other.fShortMonths, fShortMonthsCount) &&
            arrayCompare(fNarrowMonths, other.fNarrowMonths, fNarrowMonthsCount) &&
            arrayCompare(fStandaloneMonths, other.fStandaloneMonths, fStandaloneMonthsCount) &&
            arrayCompare(fStandaloneShortMonths, other.fStandaloneShortMonths, fStandaloneShortMonthsCount) &&
            arrayCompare(fStandaloneNarrowMonths, other.fStandaloneNarrowMonths, fStandaloneNarrowMonthsCount) &&
            arrayCompare(fWeekdays, other.fWeekdays, fWeekdaysCount) &&
            arrayCompare(fShortWeekdays, other.fShortWeekdays, fShortWeekdaysCount) &&
            arrayCompare(fShorterWeekdays, other.fShorterWeekdays, fShorterWeekdaysCount) &&
            arrayCompare(fNarrowWeekdays, other.fNarrowWeekdays, fNarrowWeekdaysCount) &&
            arrayCompare(fStandaloneWeekdays, other.fStandaloneWeekdays, fStandaloneWeekdaysCount) &&
            arrayCompare(fStandaloneShortWeekdays, other.fStandaloneShortWeekdays, fStandaloneShortWeekdaysCount) &&
            arrayCompare(fStandaloneShorterWeekdays, other.fStandaloneShorterWeekdays, fStandaloneShorterWeekdaysCount) &&
            arrayCompare(fStandaloneNarrowWeekdays, other.fStandaloneNarrowWeekdays, fStandaloneNarrowWeekdaysCount) &&
            arrayCompare(fAmPms, other.fAmPms, fAmPmsCount) &&
            arrayCompare(fNarrowAmPms, other.fNarrowAmPms, fNarrowAmPmsCount) &&
            fTimeSeparator == other.fTimeSeparator &&
            arrayCompare(fQuarters, other.fQuarters, fQuartersCount) &&
            arrayCompare(fShortQuarters, other.fShortQuarters, fShortQuartersCount) &&
            arrayCompare(fStandaloneQuarters, other.fStandaloneQuarters, fStandaloneQuartersCount) &&
            arrayCompare(fStandaloneShortQuarters, other.fStandaloneShortQuarters, fStandaloneShortQuartersCount) &&
            arrayCompare(fLeapMonthPatterns, other.fLeapMonthPatterns, fLeapMonthPatternsCount) &&
            arrayCompare(fShortYearNames, other.fShortYearNames, fShortYearNamesCount) &&
            arrayCompare(fShortZodiacNames, other.fShortZodiacNames, fShortZodiacNamesCount) &&
            arrayCompare(fAbbreviatedDayPeriods, other.fAbbreviatedDayPeriods, fAbbreviatedDayPeriodsCount) &&
            arrayCompare(fWideDayPeriods, other.fWideDayPeriods, fWideDayPeriodsCount) &&
            arrayCompare(fNarrowDayPeriods, other.fNarrowDayPeriods, fNarrowDayPeriodsCount) &&
            arrayCompare(fStandaloneAbbreviatedDayPeriods, other.fStandaloneAbbreviatedDayPeriods,
                         fStandaloneAbbreviatedDayPeriodsCount) &&
            arrayCompare(fStandaloneWideDayPeriods, other.fStandaloneWideDayPeriods,
                         fStandaloneWideDayPeriodsCount) &&
            arrayCompare(fStandaloneNarrowDayPeriods, other.fStandaloneNarrowDayPeriods,
                         fStandaloneWideDayPeriodsCount))
        {
            // Compare the contents of fZoneStrings
            if (fZoneStrings == NULL && other.fZoneStrings == NULL) {
                if (fZSFLocale == other.fZSFLocale) {
                    return TRUE;
                }
            } else if (fZoneStrings != NULL && other.fZoneStrings != NULL) {
                if (fZoneStringsRowCount == other.fZoneStringsRowCount
                    && fZoneStringsColCount == other.fZoneStringsColCount) {
                    UBool cmpres = TRUE;
                    for (int32_t i = 0; (i < fZoneStringsRowCount) && cmpres; i++) {
                        cmpres = arrayCompare(fZoneStrings[i], other.fZoneStrings[i], fZoneStringsColCount);
                    }
                    return cmpres;
                }
            }
            return FALSE;
        }
    }
    return FALSE;
}